

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:374:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:374:3)>
      *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Own<kj::_::PromiseNode> OStack_a8;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_98;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_60;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_60,&((this->func).env)->membraned,&local_28);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_98,(int)&local_60,__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::
  ignoreResult((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
                *)&OStack_a8);
  Promise<void>::wait((Promise<void> *)&OStack_a8,(((this->func).env)->io).waitScope);
  Own<kj::_::PromiseNode>::dispose(&OStack_a8);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)&local_98
            );
  Own<capnp::RequestHook>::dispose(&local_60.hook);
  return;
}

Assistant:

void run() override {
    func();
  }